

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::set_typical_values(PeleLM *this,bool is_restart)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  int iVar6;
  int iVar7;
  Long LVar8;
  double *pdVar9;
  long lVar10;
  MultiFab *pMVar11;
  MultiFab **ppMVar12;
  reference pdVar13;
  pointer ppVar14;
  Print *this_00;
  byte in_SIL;
  long in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int i_6;
  int i_5;
  int d;
  int idx;
  const_iterator End;
  const_iterator it;
  int i_4;
  int i_3;
  int i_2;
  double velMax;
  Vector<double,_std::allocator<double>_> velMaxV;
  Vector<double,_std::allocator<double>_> scaleMin;
  Vector<double,_std::allocator<double>_> scaleMax;
  int lev;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> Slevs;
  int i_1;
  FArrayBox tvfab;
  ifstream tvis;
  string tvfile;
  int i;
  int nComp;
  Print *in_stack_ffffffffffffee28;
  PeleLM *in_stack_ffffffffffffee30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffee40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffee48;
  char *in_stack_ffffffffffffee50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee58;
  ostream *os_;
  Print *in_stack_ffffffffffffee60;
  Print *in_stack_ffffffffffffeea0;
  undefined8 in_stack_ffffffffffffeea8;
  IntVect *in_stack_ffffffffffffeeb0;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_ffffffffffffeeb8;
  PeleLM *in_stack_fffffffffffff010;
  char *in_stack_fffffffffffff048;
  int in_stack_fffffffffffff054;
  char *in_stack_fffffffffffff058;
  char *in_stack_fffffffffffff060;
  int local_ea0;
  ostream local_e98 [399];
  undefined1 local_d09;
  undefined1 local_b79;
  undefined1 local_9e9;
  undefined1 local_859;
  Print local_858;
  int local_6cc;
  undefined1 local_539;
  int local_3b0;
  int local_3ac;
  iterator local_3a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  local_3a0;
  iterator local_398;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  local_390;
  double local_388;
  int local_37c;
  int local_378;
  int local_374;
  double *local_370;
  double *local_368;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_360;
  double local_358;
  undefined1 local_338 [48];
  int local_308;
  int local_2e4;
  BaseFab<double> local_2e0;
  char local_298 [536];
  string local_80 [32];
  string local_60 [36];
  int local_3c;
  int local_38;
  byte local_31;
  char *local_28;
  undefined8 local_20;
  undefined4 local_14;
  char *local_10;
  char *local_8;
  
  local_31 = in_SIL & 1;
  if (*(int *)(in_RDI + 8) == 0) {
    LVar8 = amrex::Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0x4e74d1);
    local_38 = (int)LVar8;
    if ((local_31 & 1) == 0) {
      amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
      std::allocator<const_amrex::MultiFab_*>::allocator
                ((allocator<const_amrex::MultiFab_*> *)0x4e785f);
      amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffee30,(size_type)in_stack_ffffffffffffee28,
                 (allocator_type *)0x4e787c);
      std::allocator<const_amrex::MultiFab_*>::~allocator
                ((allocator<const_amrex::MultiFab_*> *)0x4e788b);
      for (local_308 = 0; iVar6 = local_308,
          iVar7 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150)), iVar6 <= iVar7;
          local_308 = local_308 + 1) {
        getLevel(in_stack_ffffffffffffee30,(int)((ulong)in_stack_ffffffffffffee28 >> 0x20));
        pMVar11 = amrex::AmrLevel::get_new_data
                            ((AmrLevel *)in_stack_ffffffffffffee30,
                             (int)((ulong)in_stack_ffffffffffffee28 >> 0x20));
        ppMVar12 = amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                   ::operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                 *)in_stack_ffffffffffffee30,(size_type)in_stack_ffffffffffffee28);
        *ppMVar12 = pMVar11;
      }
      amrex::VectorMax(in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,
                       (int)((ulong)in_stack_ffffffffffffeea8 >> 0x20),
                       (int)in_stack_ffffffffffffeea8,
                       (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20));
      amrex::VectorMin(in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,
                       (int)((ulong)in_stack_ffffffffffffeea8 >> 0x20),
                       (int)in_stack_ffffffffffffeea8,
                       (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20));
      amrex::VectorMaxAbs(in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,
                          (int)((ulong)in_stack_ffffffffffffeea8 >> 0x20),
                          (int)in_stack_ffffffffffffeea8,
                          (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20));
      local_368 = (double *)
                  std::begin<amrex::Vector<double,std::allocator<double>>>
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee28);
      local_370 = (double *)
                  std::end<amrex::Vector<double,std::allocator<double>>>
                            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee28);
      local_360 = std::
                  max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
      pdVar13 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&local_360);
      local_358 = *pdVar13;
      for (local_374 = 0; local_374 < NavierStokesBase::NUM_STATE + -3; local_374 = local_374 + 1) {
        amrex::Vector<double,_std::allocator<double>_>::operator[]
                  ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                   (size_type)in_stack_ffffffffffffee28);
        iVar6 = (int)local_338;
        amrex::Vector<double,_std::allocator<double>_>::operator[]
                  ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                   (size_type)in_stack_ffffffffffffee28);
        std::abs(iVar6);
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        *pdVar9 = extraout_XMM0_Qa;
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        if (*pdVar9 <= 0.0) {
          amrex::Vector<double,_std::allocator<double>_>::operator[]
                    ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                     (size_type)in_stack_ffffffffffffee28);
          iVar6 = (int)local_338;
          amrex::Vector<double,_std::allocator<double>_>::operator[]
                    ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                     (size_type)in_stack_ffffffffffffee28);
          std::abs(iVar6);
          pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                              (size_type)in_stack_ffffffffffffee28);
          *pdVar9 = extraout_XMM0_Qa_00 * 0.5;
        }
      }
      for (local_378 = 0; dVar2 = local_358, local_378 < 3; local_378 = local_378 + 1) {
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        *pdVar9 = dVar2;
      }
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                          (size_type)in_stack_ffffffffffffee28);
      if (*pdVar9 <= 0.0) {
        local_8 = "typical_values[Density] > 0";
        local_10 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
        ;
        local_14 = 0x5a4;
        local_20 = 0;
        amrex::Assert_host(in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                           in_stack_fffffffffffff054,in_stack_fffffffffffff048);
      }
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                          (size_type)in_stack_ffffffffffffee28);
      dVar2 = *pdVar9;
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                          (size_type)in_stack_ffffffffffffee28);
      dVar1 = *pdVar9;
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                          (size_type)in_stack_ffffffffffffee28);
      *pdVar9 = dVar2 / dVar1;
      for (local_37c = 0; local_37c < 0x15; local_37c = local_37c + 1) {
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        dVar2 = *pdVar9;
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        local_388 = dVar2 / *pdVar9;
        pdVar9 = std::max<double>(&local_388,&typical_Y_val_min);
        dVar2 = *pdVar9;
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        *pdVar9 = dVar2;
      }
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x4e7eac);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x4e7eb9);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x4e7ec6);
      amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 0x4e7ed3);
    }
    else {
      for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        *pdVar9 = -1.0;
      }
      bVar3 = amrex::ParallelDescriptor::IOProcessor();
      if (bVar3) {
        amrex::Amr::theRestartFile_abi_cxx11_(*(Amr **)(in_RDI + 0x150));
        std::operator+(in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
        std::operator+(in_stack_ffffffffffffee38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee30);
        std::__cxx11::string::~string(local_80);
        std::ifstream::ifstream(local_298);
        _Var5 = std::__cxx11::string::c_str();
        std::operator|(_S_in,_S_bin);
        std::ifstream::open(local_298,_Var5);
        bVar4 = std::ios::good();
        if ((bVar4 & 1) != 0) {
          amrex::FArrayBox::FArrayBox((FArrayBox *)in_stack_ffffffffffffee30);
          amrex::FArrayBox::readFrom
                    ((FArrayBox *)in_stack_ffffffffffffee40._M_current,
                     (istream *)in_stack_ffffffffffffee38);
          iVar6 = amrex::BaseFab<double>::nComp(&local_2e0);
          LVar8 = amrex::Vector<double,_std::allocator<double>_>::size
                            ((Vector<double,_std::allocator<double>_> *)0x4e767b);
          if (iVar6 != LVar8) {
            local_28 = "Typical values file has wrong number of components";
            amrex::Abort_host((char *)in_stack_ffffffffffffee40._M_current);
          }
          for (local_2e4 = 0; lVar10 = (long)local_2e4,
              LVar8 = amrex::Vector<double,_std::allocator<double>_>::size
                                ((Vector<double,_std::allocator<double>_> *)0x4e7756),
              lVar10 < LVar8; local_2e4 = local_2e4 + 1) {
            pdVar9 = amrex::BaseFab<double>::dataPtr
                               (in_stack_ffffffffffffee48._M_current,
                                (int)((ulong)in_stack_ffffffffffffee40._M_current >> 0x20));
            dVar2 = pdVar9[local_2e4];
            pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30
                                ,(size_type)in_stack_ffffffffffffee28);
            *pdVar9 = dVar2;
          }
          amrex::FArrayBox::~FArrayBox((FArrayBox *)0x4e77cf);
        }
        std::ifstream::~ifstream(local_298);
        std::__cxx11::string::~string(local_60);
      }
      pdVar9 = amrex::Vector<double,_std::allocator<double>_>::dataPtr
                         ((Vector<double,_std::allocator<double>_> *)0x4e7816);
      amrex::ParallelDescriptor::ReduceRealMax<double>(pdVar9,local_38);
    }
    local_398._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)in_stack_ffffffffffffee28);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::_Rb_tree_const_iterator(&local_390,&local_398);
    local_3a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)in_stack_ffffffffffffee28);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::_Rb_tree_const_iterator(&local_3a0,&local_3a8);
    while (bVar3 = std::operator!=(&local_390,&local_3a0), bVar3) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    *)0x4e7f7e);
      local_3ac = getSpeciesIdx(in_stack_ffffffffffffee38);
      if (local_3ac < 0) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                      *)0x4e7fed);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28);
        if (bVar3) {
          ppVar14 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                                  *)0x4e800f);
          dVar2 = ppVar14->second;
          pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                              (size_type)in_stack_ffffffffffffee28);
          *pdVar9 = dVar2;
        }
        else {
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
          ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                        *)0x4e8052);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28);
          if (bVar3) {
            ppVar14 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                                    *)0x4e8074);
            dVar2 = ppVar14->second;
            pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30
                                ,(size_type)in_stack_ffffffffffffee28);
            *pdVar9 = dVar2;
          }
          else {
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
            ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                          *)0x4e80b4);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28);
            if (bVar3) {
              for (local_3b0 = 0; local_3b0 < 3; local_3b0 = local_3b0 + 1) {
                ppVar14 = std::
                          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                          ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                                        *)0x4e80eb);
                pdVar9 = std::max<double>(&ppVar14->second,&typical_Y_val_min);
                dVar2 = *pdVar9;
                pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                                   ((Vector<double,_std::allocator<double>_> *)
                                    in_stack_ffffffffffffee30,(size_type)in_stack_ffffffffffffee28);
                *pdVar9 = dVar2;
              }
            }
          }
        }
      }
      else {
        ppVar14 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                                *)0x4e7fa4);
        dVar2 = ppVar14->second;
        pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                            (size_type)in_stack_ffffffffffffee28);
        *pdVar9 = dVar2;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    *)in_stack_ffffffffffffee30);
    }
    update_typical_values_chem(in_stack_fffffffffffff010);
    if (NavierStokesBase::verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee60,(ostream *)in_stack_ffffffffffffee58);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(char (*) [15])in_stack_ffffffffffffee28);
      local_539 = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffeea0);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee60,(ostream *)in_stack_ffffffffffffee58);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(char (*) [12])in_stack_ffffffffffffee28);
      amrex::Print::~Print(in_stack_ffffffffffffeea0);
      for (local_6cc = 0; local_6cc < 3; local_6cc = local_6cc + 1) {
        amrex::OutStream();
        in_stack_ffffffffffffeea0 = &local_858;
        amrex::Print::Print(in_stack_ffffffffffffee60,(ostream *)in_stack_ffffffffffffee58);
        amrex::Vector<double,_std::allocator<double>_>::operator[]
                  ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                   (size_type)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee30,(double *)in_stack_ffffffffffffee28);
        local_859 = 0x20;
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28);
        amrex::Print::~Print(in_stack_ffffffffffffeea0);
      }
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee60,(ostream *)in_stack_ffffffffffffee58);
      local_9e9 = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffeea0);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee60,(ostream *)in_stack_ffffffffffffee58);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(char (*) [11])in_stack_ffffffffffffee28);
      amrex::Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                 (size_type)in_stack_ffffffffffffee28);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(double *)in_stack_ffffffffffffee28);
      local_b79 = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffeea0);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffee60,(ostream *)in_stack_ffffffffffffee58);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(char (*) [11])in_stack_ffffffffffffee28);
      amrex::Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                 (size_type)in_stack_ffffffffffffee28);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(double *)in_stack_ffffffffffffee28);
      local_d09 = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffeea0);
      amrex::OutStream();
      os_ = local_e98;
      amrex::Print::Print(in_stack_ffffffffffffee60,os_);
      this_00 = amrex::Print::operator<<
                          ((Print *)in_stack_ffffffffffffee30,
                           (char (*) [11])in_stack_ffffffffffffee28);
      amrex::Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                 (size_type)in_stack_ffffffffffffee28);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffee30,(double *)in_stack_ffffffffffffee28);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffeea0);
      for (local_ea0 = 0; local_ea0 < 0x15; local_ea0 = local_ea0 + 1) {
        amrex::OutStream();
        amrex::Print::Print(this_00,os_);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee30,(char (*) [4])in_stack_ffffffffffffee28);
        amrex::
        Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffee30,(size_type)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee28);
        in_stack_ffffffffffffee30 =
             (PeleLM *)
             amrex::Print::operator<<
                       ((Print *)in_stack_ffffffffffffee30,(char (*) [3])in_stack_ffffffffffffee28);
        amrex::Vector<double,_std::allocator<double>_>::operator[]
                  ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee30,
                   (size_type)in_stack_ffffffffffffee28);
        in_stack_ffffffffffffee28 =
             amrex::Print::operator<<
                       ((Print *)in_stack_ffffffffffffee30,(double *)in_stack_ffffffffffffee28);
        amrex::Print::operator<<
                  ((Print *)in_stack_ffffffffffffee30,(char *)in_stack_ffffffffffffee28);
        amrex::Print::~Print(in_stack_ffffffffffffeea0);
      }
    }
  }
  return;
}

Assistant:

void
PeleLM::set_typical_values(bool is_restart)
{
  if (level==0)
  {
    const int nComp = typical_values.size();

    if (is_restart)
    {
      AMREX_ASSERT(nComp==NUM_STATE);

      for (int i=0; i<nComp; ++i)
        typical_values[i] = -1;

      if (ParallelDescriptor::IOProcessor())
      {
        const std::string tvfile = parent->theRestartFile() + "/" + typical_values_filename;
        std::ifstream tvis;
        tvis.open(tvfile.c_str(),std::ios::in|std::ios::binary);

        if (tvis.good())
        {
          FArrayBox tvfab;
          tvfab.readFrom(tvis);
          if (tvfab.nComp() != typical_values.size())
            amrex::Abort("Typical values file has wrong number of components");
          for (int i=0; i<typical_values.size(); ++i)
            typical_values[i] = tvfab.dataPtr()[i];
        }
      }

      ParallelDescriptor::ReduceRealMax(typical_values.dataPtr(),nComp); //FIXME: better way?
    }
    else
    {
      Vector<const MultiFab*> Slevs(parent->finestLevel()+1);

      for (int lev = 0; lev <= parent->finestLevel(); lev++)
      {
        Slevs[lev] = &(getLevel(lev).get_new_data(State_Type));
      }

      auto scaleMax = VectorMax(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMin = VectorMin(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto velMaxV = VectorMaxAbs(Slevs,FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,0);

      auto velMax = *max_element(std::begin(velMaxV), std::end(velMaxV));

      for (int i=0; i<NUM_STATE - AMREX_SPACEDIM; ++i) {
        typical_values[i + AMREX_SPACEDIM] = std::abs(scaleMax[i] - scaleMin[i]);
          if ( typical_values[i + AMREX_SPACEDIM] <= 0.0)
              typical_values[i + AMREX_SPACEDIM] = 0.5*std::abs(scaleMax[i] + scaleMin[i]);
      }

      for (int i=0; i<AMREX_SPACEDIM; ++i) {
        typical_values[i] = velMax;
      }

      AMREX_ALWAYS_ASSERT(typical_values[Density] > 0);
      typical_values[RhoH] = typical_values[RhoH] / typical_values[Density];
      for (int i=0; i<NUM_SPECIES; ++i) {
        typical_values[first_spec + i] = std::max(typical_values[first_spec + i]/typical_values[Density],
                                                  typical_Y_val_min);
      }
    }
    //
    // If typVals specified in inputs, these take precedence componentwise.
    //
    for (std::map<std::string,Real>::const_iterator it=typical_values_FileVals.begin(),
           End=typical_values_FileVals.end();
         it!=End;
         ++it)
    {
      const int idx = getSpeciesIdx(it->first);
      if (idx>=0)
      {
        typical_values[first_spec+idx] = it->second;
      }
      else
      {
        if (it->first == "Temp")
          typical_values[Temp] = it->second;
        else if (it->first == "RhoH")
          typical_values[RhoH] = it->second;
        else if (it->first == "Vel")
        {
          for (int d=0; d<AMREX_SPACEDIM; ++d)
            typical_values[d] = std::max(it->second,typical_Y_val_min);
        }
      }
    }
    update_typical_values_chem();
    if (verbose) {
       amrex::Print() << "Typical vals: " << '\n';
       amrex::Print() << "\tVelocity: ";
       for (int i=0; i<AMREX_SPACEDIM; ++i) {
         amrex::Print() << typical_values[i] << ' ';
       }
       amrex::Print() << '\n';
       amrex::Print() << "\tDensity: " << typical_values[Density] << '\n';
       amrex::Print() << "\tTemp:    " << typical_values[Temp]    << '\n';
       amrex::Print() << "\tRhoH:    " << typical_values[RhoH]    << '\n';
       for (int i=0; i<NUM_SPECIES; ++i)
       {
           amrex::Print() << "\tY_" << spec_names[i] << ": " << typical_values[first_spec+i] <<'\n';
       }
    }
  }
}